

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint32_t flag)

{
  bool bVar1;
  InstOp IVar2;
  int iVar3;
  EmptyOp EVar4;
  int *piVar5;
  Inst *this_00;
  ostream *this_01;
  EmptyOp in_ECX;
  int in_EDX;
  Workq *in_RSI;
  undefined8 *in_RDI;
  Inst *ip;
  int nstk;
  int *stk;
  int in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  InstOp in_stack_fffffffffffffe14;
  LogMessage *in_stack_fffffffffffffe20;
  SparseSetT<void> *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  LogMessage *in_stack_fffffffffffffe50;
  int local_24;
  int local_14;
  
  piVar5 = PODArray<int>::data((PODArray<int> *)0x2248bb);
  local_24 = 1;
  *piVar5 = in_EDX;
LAB_002248f6:
  do {
    if (local_24 < 1) {
      return;
    }
    local_24 = local_24 + -1;
    local_14 = piVar5[local_24];
    while (local_14 != -1) {
      if ((local_14 == 0) ||
         (bVar1 = SparseSetT<void>::contains
                            (in_stack_fffffffffffffe28,
                             (int)((ulong)in_stack_fffffffffffffe20 >> 0x20)), bVar1))
      goto LAB_002248f6;
      Workq::insert_new((Workq *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                        in_stack_fffffffffffffe0c);
      this_00 = Prog::inst((Prog *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           in_stack_fffffffffffffe0c);
      IVar2 = Prog::Inst::opcode(this_00);
      switch(IVar2) {
      case kInstAltMatch:
        local_14 = local_14 + 1;
        break;
      case kInstByteRange:
      case kInstMatch:
        iVar3 = Prog::Inst::last(this_00);
        if (iVar3 != 0) goto LAB_002248f6;
        local_14 = local_14 + 1;
        break;
      case kInstCapture:
      case kInstNop:
        iVar3 = Prog::Inst::last(this_00);
        if (iVar3 == 0) {
          piVar5[local_24] = local_14 + 1;
          local_24 = local_24 + 1;
        }
        IVar2 = Prog::Inst::opcode(this_00);
        if ((((IVar2 == kInstNop) && (iVar3 = Workq::maxmark(in_RSI), 0 < iVar3)) &&
            (in_stack_fffffffffffffe10 = local_14, iVar3 = Prog::start_unanchored((Prog *)*in_RDI),
            in_stack_fffffffffffffe10 == iVar3)) &&
           (iVar3 = Prog::start((Prog *)*in_RDI), in_stack_fffffffffffffe0c = local_14,
           local_14 != iVar3)) {
          piVar5[local_24] = -1;
          local_24 = local_24 + 1;
        }
        local_14 = Prog::Inst::out(this_00);
        break;
      case kInstEmptyWidth:
        iVar3 = Prog::Inst::last(this_00);
        if (iVar3 == 0) {
          piVar5[local_24] = local_14 + 1;
          local_24 = local_24 + 1;
        }
        EVar4 = Prog::Inst::empty(this_00);
        if ((EVar4 & (in_ECX ^ 0xffffffff)) != 0) goto LAB_002248f6;
        local_14 = Prog::Inst::out(this_00);
        break;
      default:
        in_stack_fffffffffffffe20 = (LogMessage *)&stack0xfffffffffffffe50;
        LogMessage::LogMessage
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
        in_stack_fffffffffffffe28 =
             (SparseSetT<void> *)LogMessage::stream(in_stack_fffffffffffffe20);
        this_01 = std::operator<<((ostream *)in_stack_fffffffffffffe28,"unhandled opcode: ");
        in_stack_fffffffffffffe14 = Prog::Inst::opcode(this_00);
        std::ostream::operator<<(this_01,in_stack_fffffffffffffe14);
        LogMessage::~LogMessage(in_stack_fffffffffffffe20);
        goto LAB_002248f6;
      }
    }
    Workq::mark((Workq *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  } while( true );
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint32_t flag) {

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}